

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::StepFile::StepFileImporter::CanRead
          (StepFileImporter *this,string *file,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  char *pcStack_70;
  bool found;
  char *tokens [1];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *file_local;
  StepFileImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)file;
  file_local = (string *)this;
  BaseImporter::GetExtension(&local_58,file);
  local_38 = &local_58;
  bVar1 = std::operator==(&local_58,"stp");
  if (!bVar1) {
    bVar1 = std::operator==(local_38,"step");
    if (!bVar1) {
      lVar2 = std::__cxx11::string::length();
      if (((lVar2 == 0) || ((extension._7_1_ & 1) != 0)) && (pIStack_28 != (IOSystem *)0x0)) {
        pcStack_70 = "ISO-10303-21";
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken
                       (pIStack_28,(string *)pIOHandler_local,&stack0xffffffffffffff90,1,200,false,
                        false);
      }
      else {
        this_local._7_1_ = false;
      }
      goto LAB_00ad2967;
    }
  }
  this_local._7_1_ = true;
LAB_00ad2967:
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StepFileImporter::CanRead(const std::string& file, IOSystem* pIOHandler, bool checkSig) const {
    const std::string &extension = GetExtension(file);
    if ( extension == "stp" || extension == "step" ) {
        return true;
    } else if ((!extension.length() || checkSig) && pIOHandler) {
        const char* tokens[] = { "ISO-10303-21" };
        const bool found(SearchFileHeaderForToken(pIOHandler, file, tokens, 1));
        return found;
    }

    return false;
}